

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool P_HitWater(AActor *thing,sector_t *sec,DVector3 *pos,bool checkabove,bool alert,bool force)

{
  double dVar1;
  secplane_t *psVar2;
  DVector3 *pDVar3;
  FSplashDef *ent;
  uint uVar4;
  uint uVar5;
  int iVar6;
  F3DFloor **ppFVar7;
  FTerrainDef *pFVar8;
  byte local_119;
  FSoundID *local_118;
  FSoundID *local_108;
  byte local_e9;
  double *local_e8;
  FSoundID local_ac;
  FSoundID local_a8;
  TFlags<ActorFlag3,_unsigned_int> local_a4;
  double *local_a0;
  secplane_t *plane;
  undefined1 local_90 [3];
  bool smallsplash;
  int splashnum;
  TVector2<double> local_80;
  double local_70;
  double planez;
  F3DFloor *rover;
  uint i;
  double compare_z;
  sector_t *hsec;
  FSplashDef *pFStack_40;
  int terrainnum;
  FSplashDef *splash;
  AActor *mo;
  bool force_local;
  bool alert_local;
  DVector3 *pDStack_28;
  bool checkabove_local;
  DVector3 *pos_local;
  sector_t *sec_local;
  AActor *thing_local;
  
  mo._5_1_ = force;
  mo._6_1_ = alert;
  mo._7_1_ = checkabove;
  pDStack_28 = pos;
  pos_local = (DVector3 *)sec;
  sec_local = (sector_t *)thing;
  TFlags<ActorFlag3,_unsigned_int>::operator&
            ((TFlags<ActorFlag3,_unsigned_int> *)&mo,
             (int)thing + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&mo);
  if (uVar4 == 0) {
    if ((sec_local[1].planes[0].xform.xScale == 0.0) ||
       ((*(uint *)((long)sec_local[1].planes[0].xform.xScale + 0xe8) & 0x2000) == 0)) {
      splash = (FSplashDef *)0x0;
      compare_z = 0.0;
      if ((mo._7_1_ & 1) != 0) {
        _i = AActor::Center((AActor *)sec_local);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&rover + 4),
                   (int)sec_local +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&rover + 4));
        if (uVar4 != 0) {
          _i = _i - (sec_local->ceilingplane).normal.X;
        }
        if (_i < pDStack_28->Z) {
          return false;
        }
      }
      if ((mo._5_1_ & 1) == 0) {
        for (rover._0_4_ = 0; uVar4 = (uint)rover,
            uVar5 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)((long)pos_local[0x16].X + 0x70)),
            uVar4 < uVar5; rover._0_4_ = (uint)rover + 1) {
          ppFVar7 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)((long)pos_local[0x16].X + 0x70),
                               (ulong)(uint)rover);
          planez = (double)*ppFVar7;
          if ((((F3DFloor *)planez)->flags & 1) != 0) {
            psVar2 = (((F3DFloor *)planez)->top).plane;
            TVector2<double>::TVector2(&local_80,pDStack_28);
            local_70 = secplane_t::ZatPoint(psVar2,&local_80);
            if (((local_70 - 0.5 < pDStack_28->Z) && (pDStack_28->Z < local_70 + 0.5)) &&
               ((*(uint *)((long)planez + 0x58) & 0x12) != 0)) {
              hsec._4_4_ = sector_t::GetTerrain
                                     (*(sector_t **)((long)planez + 0x68),
                                      *(int *)((long)planez + 0x40));
              goto LAB_005b1682;
            }
            psVar2 = *(secplane_t **)planez;
            TVector2<double>::TVector2((TVector2<double> *)local_90,pDStack_28);
            local_70 = secplane_t::ZatPoint(psVar2,(DVector2 *)local_90);
            if ((local_70 < pDStack_28->Z) && (sec_local->friction <= local_70)) {
              return false;
            }
          }
        }
      }
      compare_z = (double)sector_t::GetHeightSec((sector_t *)pos_local);
      if ((((mo._5_1_ & 1) == 0) && ((sector_t_conflict *)compare_z != (sector_t_conflict *)0x0)) &&
         ((((sector_t_conflict *)compare_z)->MoreFlags & 4) != 0)) {
        hsec._4_4_ = sector_t::GetTerrain((sector_t *)compare_z,0);
      }
      else {
        hsec._4_4_ = sector_t::GetTerrain((sector_t *)pos_local,0);
      }
LAB_005b1682:
      pFVar8 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)hsec._4_4_);
      plane._4_4_ = pFVar8->Splash;
      plane._3_1_ = 0;
      if (plane._4_4_ == -1) {
        pFVar8 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)hsec._4_4_);
        thing_local._7_1_ = (bool)(pFVar8->IsLiquid & 1);
      }
      else if ((*(int *)&sec_local[1].floorplane.normal.Y < 1) ||
              (sec_local->friction < pDStack_28->Z)) {
        pDVar3 = pos_local;
        if (compare_z != 0.0) {
          pDVar3 = (DVector3 *)pos_local[0x11].Z;
        }
        local_e8 = &pDVar3[7].Y;
        local_a0 = local_e8;
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_a4,
                   (int)sec_local +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
        uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
        if (((uVar4 != 0) || (local_e9 = 0, sec_local[1].planes[0].xform.xScale != 0.0)) &&
           (local_e9 = 0, -6.0 <= (sec_local->ceilingplane).normal.X)) {
          local_e9 = mo._5_1_ ^ 0xff;
        }
        if ((local_e9 & 1) == 0) {
          pFStack_40 = TArray<FSplashDef,_FSplashDef>::operator[](&Splashes,(long)plane._4_4_);
          if (sec_local[1].damagetype.super_FName.Index < 10) {
            plane._3_1_ = 1;
          }
          if (((plane._3_1_ & 1) == 0) || (pFStack_40->SmallSplash == (PClassActor *)0x0)) {
            if (pFStack_40->SplashChunk != (PClassActor *)0x0) {
              splash = (FSplashDef *)Spawn(pFStack_40->SplashChunk,pDStack_28,ALLOW_REPLACE);
              TObjPtr<AActor>::operator=(&((AActor *)splash)->target,(AActor *)sec_local);
              if (pFStack_40->ChunkXVelShift != 0xff) {
                iVar6 = FRandom::Random2(&pr_chunk);
                *(double *)&splash[3].NormalSplashSound =
                     (double)(iVar6 << (pFStack_40->ChunkXVelShift & 0x1f)) / 65536.0;
              }
              if (pFStack_40->ChunkYVelShift != 0xff) {
                iVar6 = FRandom::Random2(&pr_chunk);
                splash[3].SmallSplash =
                     (PClassActor *)
                     ((double)(iVar6 << (pFStack_40->ChunkYVelShift & 0x1f)) / 65536.0);
              }
              dVar1 = pFStack_40->ChunkBaseZVel;
              iVar6 = FRandom::operator()(&pr_chunk);
              splash[3].SplashBase =
                   (PClassActor *)
                   (dVar1 + (double)(iVar6 << (pFStack_40->ChunkZVelShift & 0x1f)) / 65536.0);
            }
            if (pFStack_40->SplashBase != (PClassActor *)0x0) {
              splash = (FSplashDef *)Spawn(pFStack_40->SplashBase,pDStack_28,ALLOW_REPLACE);
            }
            if (((sec_local[1].planes[0].xform.xScale != 0.0) && ((pFStack_40->NoAlert & 1U) == 0))
               && ((mo._6_1_ & 1) != 0)) {
              P_NoiseAlert((AActor *)sec_local,(AActor *)sec_local,true,0.0);
            }
          }
          else {
            splash = (FSplashDef *)Spawn(pFStack_40->SmallSplash,pDStack_28,ALLOW_REPLACE);
            if ((AActor *)splash != (AActor *)0x0) {
              ((AActor *)splash)->Floorclip =
                   pFStack_40->SmallSplashClip + ((AActor *)splash)->Floorclip;
            }
          }
          pDVar3 = pDStack_28;
          ent = splash;
          if (splash == (FSplashDef *)0x0) {
            if ((plane._3_1_ & 1) == 0) {
              local_118 = &pFStack_40->NormalSplashSound;
            }
            else {
              local_118 = &pFStack_40->SmallSplashSound;
            }
            FSoundID::FSoundID(&local_ac,local_118);
            S_Sound(pDVar3,3,&local_ac,1.0,1.001);
          }
          else {
            if ((plane._3_1_ & 1) == 0) {
              local_108 = &pFStack_40->NormalSplashSound;
            }
            else {
              local_108 = &pFStack_40->SmallSplashSound;
            }
            FSoundID::FSoundID(&local_a8,local_108);
            S_Sound((AActor *)ent,3,&local_a8,1.0,1.001);
          }
          if (local_a0 == &pos_local[7].Y) {
            pFVar8 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)hsec._4_4_);
            local_119 = pFVar8->IsLiquid;
          }
          else {
            local_119 = 0;
          }
          thing_local._7_1_ = (bool)(local_119 & 1);
        }
        else {
          pFVar8 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)hsec._4_4_);
          thing_local._7_1_ = (bool)(pFVar8->IsLiquid & 1);
        }
      }
      else {
        pFVar8 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)hsec._4_4_);
        thing_local._7_1_ = (bool)(pFVar8->IsLiquid & 1);
      }
    }
    else {
      thing_local._7_1_ = false;
    }
  }
  else {
    thing_local._7_1_ = false;
  }
  return thing_local._7_1_;
}

Assistant:

bool P_HitWater (AActor * thing, sector_t * sec, const DVector3 &pos, bool checkabove, bool alert, bool force)
{
	if (thing->flags3 & MF3_DONTSPLASH)
		return false;

	if (thing->player && (thing->player->cheats & CF_PREDICTING))
		return false;

	AActor *mo = NULL;
	FSplashDef *splash;
	int terrainnum;
	sector_t *hsec = NULL;
	
	// don't splash above the object
	if (checkabove)
	{
		double compare_z = thing->Center();
		// Missiles are typically small and fast, so they might
		// end up submerged by the move that calls P_HitWater.
		if (thing->flags & MF_MISSILE)
			compare_z -= thing->Vel.Z;
		if (pos.Z > compare_z) 
			return false;
	}

#if 0 // needs some rethinking before activation

	// This avoids spawning splashes on invisible self referencing sectors.
	// For network consistency do this only in single player though because
	// it is not guaranteed that all players have GL nodes loaded.
	if (!multiplayer && thing->subsector->sector != thing->subsector->render_sector)
	{
		double zs = thing->subsector->sector->floorplane.ZatPoint(pos);
		double zr = thing->subsector->render_sector->floorplane.ZatPoint(pos);

		if (zs > zr && thing->Z() >= zs) return false;
	}
#endif

	// 'force' means, we want this sector's terrain, no matter what.
	if (!force)
	{
		for (unsigned int i = 0; i<sec->e->XFloor.ffloors.Size(); i++)
		{
			F3DFloor * rover = sec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;
			double planez = rover->top.plane->ZatPoint(pos);
				if (pos.Z > planez - 0.5 && pos.Z < planez + 0.5)	// allow minor imprecisions
			{
				if (rover->flags & (FF_SOLID | FF_SWIMMABLE))
				{
					terrainnum = rover->model->GetTerrain(rover->top.isceiling);
					goto foundone;
				}
			}
			planez = rover->bottom.plane->ZatPoint(pos);
			if (planez < pos.Z && !(planez < thing->floorz)) return false;
		}
	}
	hsec = sec->GetHeightSec();
	if (force || hsec == NULL || !(hsec->MoreFlags & SECF_CLIPFAKEPLANES))
	{
		terrainnum = sec->GetTerrain(sector_t::floor);
	}
	else
	{
		terrainnum = hsec->GetTerrain(sector_t::floor);
	}
foundone:

	int splashnum = Terrains[terrainnum].Splash;
	bool smallsplash = false;
	const secplane_t *plane;

	if (splashnum == -1)
		return Terrains[terrainnum].IsLiquid;

	// don't splash when touching an underwater floor
	if (thing->waterlevel >= 1 && pos.Z <= thing->floorz) return Terrains[terrainnum].IsLiquid;

	plane = hsec != NULL? &sec->heightsec->floorplane : &sec->floorplane;

	// Don't splash for living things with small vertical velocities.
	// There are levels where the constant splashing from the monsters gets extremely annoying
	if (((thing->flags3&MF3_ISMONSTER || thing->player) && thing->Vel.Z >= -6) && !force)
		return Terrains[terrainnum].IsLiquid;

	splash = &Splashes[splashnum];

	// Small splash for small masses
	if (thing->Mass < 10)
		smallsplash = true;

	if (smallsplash && splash->SmallSplash)
	{
		mo = Spawn (splash->SmallSplash, pos, ALLOW_REPLACE);
		if (mo) mo->Floorclip += splash->SmallSplashClip;
	}
	else
	{
		if (splash->SplashChunk)
		{
			mo = Spawn (splash->SplashChunk, pos, ALLOW_REPLACE);
			mo->target = thing;
			if (splash->ChunkXVelShift != 255)
			{
				mo->Vel.X = (pr_chunk.Random2() << splash->ChunkXVelShift) / 65536.;
			}
			if (splash->ChunkYVelShift != 255)
			{
				mo->Vel.Y = (pr_chunk.Random2() << splash->ChunkYVelShift) / 65536.;
			}
			mo->Vel.Z = splash->ChunkBaseZVel + (pr_chunk() << splash->ChunkZVelShift) / 65536.;
		}
		if (splash->SplashBase)
		{
			mo = Spawn (splash->SplashBase, pos, ALLOW_REPLACE);
		}
		if (thing->player && !splash->NoAlert && alert)
		{
			P_NoiseAlert (thing, thing, true);
		}
	}
	if (mo)
	{
		S_Sound (mo, CHAN_ITEM, smallsplash ?
			splash->SmallSplashSound : splash->NormalSplashSound,
			1, ATTN_IDLE);
	}
	else
	{
		S_Sound (pos, CHAN_ITEM, smallsplash ?
			splash->SmallSplashSound : splash->NormalSplashSound,
			1, ATTN_IDLE);
	}

	// Don't let deep water eat missiles
	return plane == &sec->floorplane ? Terrains[terrainnum].IsLiquid : false;
}